

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::ConvexPartition
          (dgPolyhedra *this,HaF64 *vertex,HaI32 strideInBytes,dgPolyhedra *leftOversOut)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint i0;
  dgEdge *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  float fVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  double dVar15;
  dgTemplateVector<double> dVar16;
  dgTree<dgEdge,_long> *pdVar17;
  dgVector dVar18;
  HaI32 HVar19;
  dgTreeNode *pdVar20;
  dgEdge *pdVar21;
  dgEdge *pdVar22;
  ulong uVar23;
  long lVar24;
  dgEdge *pdVar25;
  dgRedBackNode *pdVar26;
  long lVar27;
  dgEdge *pdVar28;
  int stride;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  dgVector p1;
  dgVector e0;
  double dStack_1a188;
  double dStack_1a180;
  dgBigVector p1_1;
  dgBigVector p0_1;
  Iterator iter;
  Iterator iter_2;
  dgVector p2;
  dgVector p0;
  double dStack_1a0d8;
  double dStack_1a0d0;
  undefined1 auStack_1a0a8 [16];
  double dStack_1a098;
  double dStack_1a090;
  dgPolyhedra buildConvex;
  dgPolyhedra flatFace;
  Iterator iter_1;
  double dStack_1a028;
  double dStack_1a020;
  HaI32 polygon [8192];
  dgEdge *diagonalsPool [8192];
  
  if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
    Triangulate(this,vertex,strideInBytes,leftOversOut);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    Optimize(this,vertex,strideInBytes,9.999999747378752e-05);
    DeleteDegenerateFaces(this,vertex,strideInBytes,9.999999747378752e-06);
    if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
      dgPolyhedra(&buildConvex);
      iter.m_ptr = (dgRedBackNode *)0x0;
      iter.m_tree = &this->super_dgTree<dgEdge,_long>;
      iter.m_ptr = &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->
                    super_dgRedBackNode;
      stride = strideInBytes >> 3;
      while (pdVar26 = iter.m_ptr, iter.m_ptr != (dgRedBackNode *)0x0) {
        dgTree<dgEdge,_long>::Iterator::operator++(&iter,0);
        if (0 < *(int *)((long)&pdVar26[1]._vptr_dgRedBackNode + 4)) {
          dgPolyhedra(&flatFace);
          MarkAdjacentCoplanarFaces(this,&flatFace,(dgEdge *)(pdVar26 + 1),vertex,strideInBytes);
          if (flatFace.super_dgTree<dgEdge,_long>.m_count != 0) {
            pdVar25 = (dgEdge *)vertex;
            RefineTriangulation(&flatFace,vertex,stride);
            HVar19 = IncLRU(&flatFace);
            p1_1.super_dgTemplateVector<double>.m_y = (double)&flatFace;
            pdVar20 = dgTree<dgEdge,_long>::Minimum(&flatFace.super_dgTree<dgEdge,_long>);
            uVar29 = 0;
            p1_1.super_dgTemplateVector<double>.m_x = (double)pdVar20;
            while (pdVar20 != (dgTreeNode *)0x0) {
              if (((pdVar20->m_info).m_incidentFace < 0) && ((pdVar20->m_info).m_mark != HVar19)) {
                pdVar28 = &pdVar20->m_info;
                pdVar25 = pdVar28;
                do {
                  pdVar25->m_mark = HVar19;
                  pdVar25 = pdVar25->m_next;
                } while (pdVar25 != pdVar28);
                (&iter_1.m_ptr)[(int)uVar29] = (dgRedBackNode *)pdVar28;
                if (0x3fe < (int)uVar29) {
                  __assert_fail("perimeterCount < hacd::HaI32 (sizeof (edgePerimeters) / sizeof (edgePerimeters[0]))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                ,0xddf,
                                "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                               );
                }
                uVar29 = uVar29 + 1;
              }
              pdVar25 = (dgEdge *)0x0;
              dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&p1_1,0);
              pdVar20 = (dgTreeNode *)p1_1.super_dgTemplateVector<double>.m_x;
            }
            uVar23 = 0;
            while( true ) {
              lVar30 = (long)stride;
              if (uVar23 == (~((int)uVar29 >> 0x1f) & uVar29)) break;
              pdVar22 = (dgEdge *)(&iter_1.m_ptr)[uVar23];
              dgBigVector::dgBigVector(&p0_1,vertex + pdVar22->m_incidentVertex * lVar30);
              dgVector::dgVector(&p0,&p0_1);
              dgBigVector::dgBigVector(&p0_1,vertex + pdVar22->m_next->m_incidentVertex * lVar30);
              dgVector::dgVector(&p1,&p0_1);
              dVar16 = _p0;
              auVar35._8_8_ = 0;
              auVar35._0_4_ = p1.super_dgTemplateVector<float>.m_x;
              auVar35._4_4_ = p1.super_dgTemplateVector<float>.m_y;
              auVar41._8_8_ = 0;
              auVar41._0_4_ = p0.super_dgTemplateVector<float>.m_x;
              auVar41._4_4_ = p0.super_dgTemplateVector<float>.m_y;
              auVar8 = vsubps_avx(auVar35,auVar41);
              p0.super_dgTemplateVector<float>.m_z = dVar16.m_y._0_4_;
              auVar4 = vinsertps_avx(ZEXT416((uint)(p1.super_dgTemplateVector<float>.m_z -
                                                   p0.super_dgTemplateVector<float>.m_z)),
                                     ZEXT416((uint)p1.super_dgTemplateVector<float>.m_w),0x10);
              p0_1.super_dgTemplateVector<double>._0_16_ = vmovlhps_avx(auVar8,auVar4);
              _p0 = dVar16;
              dgVector::dgVector(&e0,(dgTemplateVector<float> *)&p0_1);
              auVar42._4_4_ = e0.super_dgTemplateVector<float>.m_y;
              auVar42._0_4_ = e0.super_dgTemplateVector<float>.m_x;
              auVar42._8_8_ = 0;
              auVar51._0_4_ =
                   e0.super_dgTemplateVector<float>.m_x * e0.super_dgTemplateVector<float>.m_x;
              auVar51._4_4_ =
                   e0.super_dgTemplateVector<float>.m_y * e0.super_dgTemplateVector<float>.m_y;
              auVar51._8_8_ = 0;
              auVar4 = vmovshdup_avx(auVar51);
              auVar4 = vfmadd231ss_fma(auVar4,auVar42,auVar42);
              auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)e0.super_dgTemplateVector<float>.m_z),
                                       ZEXT416((uint)e0.super_dgTemplateVector<float>.m_z));
              auVar4 = vsqrtss_avx(auVar4,auVar4);
              fVar49 = 1.0 / (auVar4._0_4_ + 1e-12);
              auVar4 = vinsertps_avx(ZEXT416((uint)(e0.super_dgTemplateVector<float>.m_z * fVar49)),
                                     ZEXT416((uint)e0.super_dgTemplateVector<float>.m_w),0x10);
              auVar43._0_4_ = e0.super_dgTemplateVector<float>.m_x * fVar49;
              auVar43._4_4_ = e0.super_dgTemplateVector<float>.m_y * fVar49;
              auVar43._8_4_ = fVar49 * 0.0;
              auVar43._12_4_ = fVar49 * 0.0;
              p2.super_dgTemplateVector<float> =
                   (dgTemplateVector<float>)vmovlhps_avx(auVar43,auVar4);
              dgVector::dgVector((dgVector *)&p0_1,&p2.super_dgTemplateVector<float>);
              e0.super_dgTemplateVector<float>.m_x = p0_1.super_dgTemplateVector<double>.m_x._0_4_;
              e0.super_dgTemplateVector<float>.m_y = p0_1.super_dgTemplateVector<double>.m_x._4_4_;
              e0.super_dgTemplateVector<float>.m_z = p0_1.super_dgTemplateVector<double>.m_y._0_4_;
              e0.super_dgTemplateVector<float>.m_w = p0_1.super_dgTemplateVector<double>.m_y._4_4_;
              pdVar28 = pdVar22;
              do {
                dgBigVector::dgBigVector
                          (&p0_1,vertex + pdVar22->m_next->m_next->m_incidentVertex * lVar30);
                dgVector::dgVector(&p2,&p0_1);
                dVar18 = p2;
                auVar36._8_8_ = 0;
                auVar36._0_4_ = p2.super_dgTemplateVector<float>.m_x;
                auVar36._4_4_ = p2.super_dgTemplateVector<float>.m_y;
                auVar44._8_8_ = 0;
                auVar44._0_4_ = p1.super_dgTemplateVector<float>.m_x;
                auVar44._4_4_ = p1.super_dgTemplateVector<float>.m_y;
                auVar8 = vsubps_avx(auVar36,auVar44);
                p2.super_dgTemplateVector<float>.m_z = dVar18.super_dgTemplateVector<float>.m_z;
                p2.super_dgTemplateVector<float>.m_w = dVar18.super_dgTemplateVector<float>.m_w;
                auVar4 = vinsertps_avx(ZEXT416((uint)(p2.super_dgTemplateVector<float>.m_z -
                                                     p1.super_dgTemplateVector<float>.m_z)),
                                       ZEXT416((uint)p2.super_dgTemplateVector<float>.m_w),0x10);
                auStack_1a0a8 = vmovlhps_avx(auVar8,auVar4);
                p2 = dVar18;
                dgVector::dgVector((dgVector *)&p0_1,(dgTemplateVector<float> *)auStack_1a0a8);
                auVar45._8_8_ = 0;
                auVar45._0_8_ = p0_1.super_dgTemplateVector<double>.m_x;
                pdVar25 = (dgEdge *)&iter_2;
                fVar49 = p0_1.super_dgTemplateVector<double>.m_x._0_4_;
                auVar52._0_4_ = fVar49 * fVar49;
                fVar7 = p0_1.super_dgTemplateVector<double>.m_x._4_4_;
                auVar52._4_4_ = fVar7 * fVar7;
                auVar52._8_8_ = 0;
                auVar4 = vmovshdup_avx(auVar52);
                auVar4 = vfmadd231ss_fma(auVar4,auVar45,auVar45);
                auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)p0_1.super_dgTemplateVector<double>.
                                                              m_y._0_4_),
                                         ZEXT416((uint)p0_1.super_dgTemplateVector<double>.m_y._0_4_
                                                ));
                auVar4 = vsqrtss_avx(auVar4,auVar4);
                fVar50 = 1.0 / (auVar4._0_4_ + 1e-12);
                auVar4 = vinsertps_avx(ZEXT416((uint)(p0_1.super_dgTemplateVector<double>.m_y._0_4_
                                                     * fVar50)),
                                       ZEXT416(p0_1.super_dgTemplateVector<double>.m_y._4_4_),0x10);
                auVar46._0_4_ = fVar49 * fVar50;
                auVar46._4_4_ = fVar7 * fVar50;
                auVar46._8_4_ = fVar50 * 0.0;
                auVar46._12_4_ = fVar50 * 0.0;
                iter_2 = (Iterator)vmovlhps_avx(auVar46,auVar4);
                dgVector::dgVector((dgVector *)auStack_1a0a8,(dgTemplateVector<float> *)pdVar25);
                p0_1.super_dgTemplateVector<double>.m_x = (double)auStack_1a0a8._0_8_;
                p0_1.super_dgTemplateVector<double>.m_y = (double)auStack_1a0a8._8_8_;
                auVar8 = (undefined1  [16])p0_1.super_dgTemplateVector<double>._0_16_;
                p0_1.super_dgTemplateVector<double>.m_x._4_4_ = auStack_1a0a8._4_4_;
                p0_1.super_dgTemplateVector<double>.m_x._0_4_ = auStack_1a0a8._0_4_;
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(p0_1.super_dgTemplateVector<double>.m_x.
                                                        _4_4_ * e0.super_dgTemplateVector<float>.m_y
                                                       )),
                                         ZEXT416((uint)p0_1.super_dgTemplateVector<double>.m_x._0_4_
                                                ),ZEXT416((uint)e0.super_dgTemplateVector<float>.m_x
                                                         ));
                p0_1.super_dgTemplateVector<double>.m_y._0_4_ = auStack_1a0a8._8_4_;
                auVar4 = vfmadd132ss_fma(ZEXT416((uint)p0_1.super_dgTemplateVector<double>.m_y._0_4_
                                                ),auVar4,
                                         ZEXT416((uint)e0.super_dgTemplateVector<float>.m_z));
                p0_1.super_dgTemplateVector<double>._0_16_ = auVar8;
                if (auVar4._0_4_ <= 0.9999) {
LAB_00da454e:
                  bVar34 = false;
                  e0.super_dgTemplateVector<float>.m_x =
                       p0_1.super_dgTemplateVector<double>.m_x._0_4_;
                  e0.super_dgTemplateVector<float>.m_y =
                       p0_1.super_dgTemplateVector<double>.m_x._4_4_;
                  e0.super_dgTemplateVector<float>.m_z =
                       p0_1.super_dgTemplateVector<double>.m_y._0_4_;
                  e0.super_dgTemplateVector<float>.m_w =
                       p0_1.super_dgTemplateVector<double>.m_y._4_4_;
                  p1.super_dgTemplateVector<float>._0_8_ = p2.super_dgTemplateVector<float>._0_8_;
                  p1.super_dgTemplateVector<float>.m_z = p2.super_dgTemplateVector<float>.m_z;
                  p1.super_dgTemplateVector<float>.m_w = p2.super_dgTemplateVector<float>.m_w;
                  pdVar22 = pdVar22->m_next;
                }
                else {
                  while( true ) {
                    pdVar28 = pdVar22->m_next;
                    pdVar21 = pdVar28->m_twin;
                    pdVar25 = pdVar21->m_next;
                    if (pdVar25 == pdVar22->m_twin) break;
                    DeleteEdge(&flatFace,pdVar25);
                  }
                  pdVar3 = pdVar22->m_twin->m_next;
                  if (pdVar3->m_next->m_next == pdVar25) {
                    if (pdVar3->m_incidentFace < 1) {
                      __assert_fail("ptr->m_twin->m_next->m_incidentFace > 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                    ,0xdf8,
                                    "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                   );
                    }
                    DeleteEdge(&flatFace,pdVar3);
                    pdVar28 = pdVar22->m_next;
                    pdVar21 = pdVar28->m_twin;
                    pdVar25 = pdVar21->m_next;
                  }
                  if (pdVar25->m_twin != pdVar22) {
                    __assert_fail("ptr->m_next->m_twin->m_next->m_twin == ptr",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xdfc,
                                  "void RemoveColinearVertices(dgPolyhedra &, const hacd::HaF64 *const, hacd::HaI32)"
                                 );
                  }
                  pdVar25 = (dgEdge *)(ulong)(uint)pdVar22->m_incidentVertex;
                  pdVar21 = FindEdge(&flatFace,pdVar22->m_incidentVertex,pdVar21->m_incidentVertex);
                  if (pdVar21 != (dgEdge *)0x0) goto LAB_00da454e;
                  i0 = pdVar28->m_twin->m_incidentVertex;
                  pdVar25 = (dgEdge *)(ulong)i0;
                  pdVar21 = FindEdge(&flatFace,i0,pdVar22->m_incidentVertex);
                  if (pdVar21 != (dgEdge *)0x0) goto LAB_00da454e;
                  pdVar25 = pdVar28->m_twin;
                  pdVar21 = pdVar22->m_twin;
                  pdVar3 = pdVar25->m_prev;
                  pdVar21->m_prev = pdVar3;
                  pdVar3->m_next = pdVar21;
                  pdVar21 = pdVar28->m_next;
                  pdVar21->m_prev = pdVar22;
                  pdVar22->m_next = pdVar21;
                  pdVar28->m_next = pdVar25;
                  pdVar28->m_prev = pdVar25;
                  pdVar25->m_next = pdVar28;
                  pdVar25->m_prev = pdVar28;
                  DeleteEdge(&flatFace,pdVar28);
                  pdVar25 = pdVar22->m_twin;
                  ChangeEdgeIncidentVertex(&flatFace,pdVar25,pdVar22->m_next->m_incidentVertex);
                  bVar34 = true;
                  p1.super_dgTemplateVector<float>._0_8_ = p2.super_dgTemplateVector<float>._0_8_;
                  p1.super_dgTemplateVector<float>.m_z = p2.super_dgTemplateVector<float>.m_z;
                  p1.super_dgTemplateVector<float>.m_w = p2.super_dgTemplateVector<float>.m_w;
                  pdVar28 = pdVar22;
                }
              } while (pdVar22 != pdVar28 || bVar34);
              uVar23 = uVar23 + 1;
            }
            HVar19 = IncLRU(&flatFace);
            iter_1.m_tree = &flatFace.super_dgTree<dgEdge,_long>;
            iter_1.m_ptr = &dgTree<dgEdge,_long>::Minimum(&flatFace.super_dgTree<dgEdge,_long>)->
                            super_dgRedBackNode;
            uVar29 = 0;
            while (iter_1.m_ptr != (dgRedBackNode *)0x0) {
              if (((*(int *)&iter_1.m_ptr[2]._vptr_dgRedBackNode != HVar19) &&
                  (0 < *(int *)((long)&iter_1.m_ptr[1]._vptr_dgRedBackNode + 4))) &&
                 (0 < *(int *)(*(long *)&iter_1.m_ptr[1].field_0x20 + 4))) {
                *(HaI32 *)(*(long *)&iter_1.m_ptr[1].field_0x20 + 0x28) = HVar19;
                if ((int)uVar29 < 0x2000) {
                  lVar27 = (long)(int)uVar29;
                  uVar29 = uVar29 + 1;
                  diagonalsPool[lVar27] = (dgEdge *)(iter_1.m_ptr + 1);
                }
                else {
                  bVar34 = uVar29 != 0x2000;
                  uVar29 = 0x2000;
                  if (bVar34) {
                    __assert_fail("count <= maxCount",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xe2d,
                                  "hacd::HaI32 GetInteriorDiagonals(dgPolyhedra &, dgEdge **const, hacd::HaI32)"
                                 );
                  }
                }
              }
              *(HaI32 *)&iter_1.m_ptr[2]._vptr_dgRedBackNode = HVar19;
              pdVar25 = (dgEdge *)0x0;
              dgTree<dgEdge,_long>::Iterator::operator++(&iter_1,0);
            }
            if (uVar29 != 0) {
              if (((flatFace.super_dgTree<dgEdge,_long>.m_head)->m_info).m_incidentFace < 0) {
                pdVar28 = ((flatFace.super_dgTree<dgEdge,_long>.m_head)->m_info).m_twin;
              }
              else {
                pdVar28 = &(flatFace.super_dgTree<dgEdge,_long>.m_head)->m_info;
              }
              if (pdVar28->m_incidentFace < 1) {
                __assert_fail("edge->m_incidentFace > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xe82,
                              "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                             );
              }
              FaceNormal((dgBigVector *)&iter_1,(dgPolyhedra *)pdVar25,pdVar28,vertex,strideInBytes)
              ;
              auVar8._8_8_ = iter_1.m_tree;
              auVar8._0_8_ = iter_1.m_ptr;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = dStack_1a028;
              auVar58._0_8_ = (double)iter_1.m_ptr * (double)iter_1.m_ptr;
              auVar58._8_8_ = (double)iter_1.m_tree * (double)iter_1.m_tree;
              auVar4 = vshufpd_avx(auVar58,auVar58,1);
              auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar8);
              auVar4 = vfmadd231sd_fma(auVar4,auVar37,auVar37);
              auVar4 = vsqrtsd_avx(auVar4,auVar4);
              dVar56 = 1.0 / auVar4._0_8_;
              p1_1.super_dgTemplateVector<double>.m_y = (double)iter_1.m_tree * dVar56;
              p1_1.super_dgTemplateVector<double>.m_x = (double)iter_1.m_ptr * dVar56;
              p1_1.super_dgTemplateVector<double>.m_z = dStack_1a028 * dVar56;
              p1_1.super_dgTemplateVector<double>.m_w = dStack_1a020;
              dgBigVector::dgBigVector(&p0_1,&p1_1.super_dgTemplateVector<double>);
              dVar56 = p0_1.super_dgTemplateVector<double>.m_z;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = &flatFace;
              iter_2 = (Iterator)(auVar4 << 0x40);
              iter_1.m_ptr = (dgRedBackNode *)p0_1.super_dgTemplateVector<double>.m_x;
              iter_1.m_tree = (dgTree<dgEdge,_long> *)p0_1.super_dgTemplateVector<double>.m_y;
              dStack_1a028 = p0_1.super_dgTemplateVector<double>.m_z;
              dStack_1a020 = p0_1.super_dgTemplateVector<double>.m_w;
              pdVar20 = dgTree<dgEdge,_long>::Minimum(&flatFace.super_dgTree<dgEdge,_long>);
              iter_2.m_ptr = &pdVar20->super_dgRedBackNode;
              pdVar25 = (dgEdge *)0x0;
              while (pdVar20 != (dgTreeNode *)0x0) {
                pdVar25 = &pdVar20->m_info;
                if ((pdVar20->m_info).m_incidentFace < 0) goto LAB_00da47a8;
                dgTree<dgEdge,_long>::Iterator::operator++(&iter_2,0);
                pdVar20 = (dgTreeNode *)iter_2.m_ptr;
              }
              if (pdVar25 == (dgEdge *)0x0) {
                __assert_fail("edge",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xe8f,
                              "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                             );
              }
LAB_00da47a8:
              HVar19 = IncLRU(&flatFace);
              pdVar17 = iter_1.m_tree;
              pdVar26 = iter_1.m_ptr;
              dgBigVector::dgBigVector(&p0_1,vertex + pdVar25->m_prev->m_incidentVertex * lVar30);
              dgBigVector::dgBigVector(&p1_1,vertex + pdVar25->m_incidentVertex * lVar30);
              dVar15 = p1_1.super_dgTemplateVector<double>.m_w;
              auVar4 = vsubpd_avx((undefined1  [16])p1_1.super_dgTemplateVector<double>._0_16_,
                                  (undefined1  [16])p0_1.super_dgTemplateVector<double>._0_16_);
              dVar9 = p1_1.super_dgTemplateVector<double>.m_z -
                      p0_1.super_dgTemplateVector<double>.m_z;
              p1.super_dgTemplateVector<float>._0_8_ = auVar4._0_8_;
              p1.super_dgTemplateVector<float>.m_z = auVar4._8_4_;
              p1.super_dgTemplateVector<float>.m_w = auVar4._12_4_;
              dgBigVector::dgBigVector((dgBigVector *)&p0,(dgTemplateVector<double> *)&p1);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = dStack_1a0d8;
              dVar5 = p0.super_dgTemplateVector<float>._0_8_;
              auVar59._0_8_ = dVar5 * dVar5;
              dVar6 = p0.super_dgTemplateVector<float>._8_8_;
              auVar59._8_8_ = dVar6 * dVar6;
              auVar4 = vshufpd_avx(auVar59,auVar59,1);
              auVar4 = vfmadd231sd_fma(auVar4,(undefined1  [16])p0.super_dgTemplateVector<float>,
                                       (undefined1  [16])p0.super_dgTemplateVector<float>);
              auVar4 = vfmadd231sd_fma(auVar4,auVar38,auVar38);
              auVar4 = vsqrtsd_avx(auVar4,auVar4);
              dVar57 = (double)(1.0 / ((float)auVar4._0_8_ + 1e-14));
              dStack_1a188 = dStack_1a0d8 * dVar57;
              e0.super_dgTemplateVector<float>._0_8_ = dVar5 * dVar57;
              e0.super_dgTemplateVector<float>._8_8_ = dVar6 * dVar57;
              dStack_1a180 = dStack_1a0d0;
              dgBigVector::dgBigVector((dgBigVector *)&p1,(dgTemplateVector<double> *)&e0);
              p0.super_dgTemplateVector<float>.m_w = p1.super_dgTemplateVector<float>.m_w;
              p0.super_dgTemplateVector<float>.m_z = p1.super_dgTemplateVector<float>.m_z;
              p0.super_dgTemplateVector<float>.m_x = p1.super_dgTemplateVector<float>.m_x;
              p0.super_dgTemplateVector<float>.m_y = p1.super_dgTemplateVector<float>.m_y;
              dStack_1a0d8 = dVar9;
              dStack_1a0d0 = dVar15;
              pdVar28 = pdVar25;
              dVar18 = p2;
              uVar12 = e0.super_dgTemplateVector<float>._0_8_;
              uVar13 = e0.super_dgTemplateVector<float>._8_8_;
              do {
                p2.super_dgTemplateVector<float> = dVar18.super_dgTemplateVector<float>;
                e0.super_dgTemplateVector<float>._0_8_ = uVar12;
                e0.super_dgTemplateVector<float>._8_8_ = uVar13;
                dgBigVector::dgBigVector
                          ((dgBigVector *)&p1,vertex + pdVar28->m_next->m_incidentVertex * lVar30);
                auVar10._8_4_ = p1.super_dgTemplateVector<float>.m_z;
                auVar10._0_4_ = p1.super_dgTemplateVector<float>.m_x;
                auVar10._4_4_ = p1.super_dgTemplateVector<float>.m_y;
                auVar10._12_4_ = p1.super_dgTemplateVector<float>.m_w;
                p2.super_dgTemplateVector<float> =
                     (dgTemplateVector<float>)
                     vsubpd_avx(auVar10,(undefined1  [16])p1_1.super_dgTemplateVector<double>._0_16_
                               );
                dVar6 = dVar9 - p1_1.super_dgTemplateVector<double>.m_z;
                dgBigVector::dgBigVector((dgBigVector *)&e0,(dgTemplateVector<double> *)&p2);
                auVar11._8_4_ = e0.super_dgTemplateVector<float>.m_z;
                auVar11._0_4_ = e0.super_dgTemplateVector<float>.m_x;
                auVar11._4_4_ = e0.super_dgTemplateVector<float>.m_y;
                auVar11._12_4_ = e0.super_dgTemplateVector<float>.m_w;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = dStack_1a188;
                auVar60._0_8_ =
                     (double)e0.super_dgTemplateVector<float>._0_8_ *
                     (double)e0.super_dgTemplateVector<float>._0_8_;
                dVar5 = auVar11._8_8_;
                auVar60._8_8_ = dVar5 * dVar5;
                auVar4 = vshufpd_avx(auVar60,auVar60,1);
                auVar4 = vfmadd231sd_fma(auVar4,auVar11,auVar11);
                auVar4 = vfmadd231sd_fma(auVar4,auVar39,auVar39);
                auVar4 = vsqrtsd_avx(auVar4,auVar4);
                dVar57 = 1.0 / (auVar4._0_8_ + 9.9999998245167e-15);
                dStack_1a098 = dStack_1a188 * dVar57;
                auStack_1a0a8._8_8_ = dVar5 * dVar57;
                auStack_1a0a8._0_8_ = (double)e0.super_dgTemplateVector<float>._0_8_ * dVar57;
                dStack_1a090 = dStack_1a180;
                dgBigVector::dgBigVector
                          ((dgBigVector *)&p2,(dgTemplateVector<double> *)auStack_1a0a8);
                dVar16 = _p0;
                dVar18 = p2;
                dStack_1a180 = dVar15;
                auVar61._8_8_ = 0;
                auVar61._0_8_ = dStack_1a0d8;
                auVar47._8_8_ = 0;
                auVar47._0_4_ = p0.super_dgTemplateVector<float>.m_z;
                auVar47._4_4_ = p0.super_dgTemplateVector<float>.m_w;
                e0.super_dgTemplateVector<float>.m_x = p2.super_dgTemplateVector<float>.m_x;
                e0.super_dgTemplateVector<float>.m_y = p2.super_dgTemplateVector<float>.m_y;
                e0.super_dgTemplateVector<float>.m_z = p2.super_dgTemplateVector<float>.m_z;
                e0.super_dgTemplateVector<float>.m_w = p2.super_dgTemplateVector<float>.m_w;
                p0.super_dgTemplateVector<float>._0_8_ = dVar16.m_x;
                auVar40._8_8_ = 0;
                auVar40._0_4_ = p0.super_dgTemplateVector<float>.m_x;
                auVar40._4_4_ = p0.super_dgTemplateVector<float>.m_y;
                auVar63._8_8_ = 0;
                auVar63._0_4_ = p2.super_dgTemplateVector<float>.m_z;
                auVar63._4_4_ = p2.super_dgTemplateVector<float>.m_w;
                auVar53._8_8_ = 0;
                auVar53._0_8_ = dVar6;
                auVar62._8_8_ = 0;
                auVar62._0_4_ = p2.super_dgTemplateVector<float>.m_x;
                auVar62._4_4_ = p2.super_dgTemplateVector<float>.m_y;
                auVar64._8_8_ = 0;
                auVar64._0_8_ = (double)p2.super_dgTemplateVector<float>._8_8_ * dStack_1a0d8;
                auVar4 = vfmsub231sd_fma(auVar64,auVar47,auVar53);
                auVar54._8_8_ = 0;
                auVar54._0_8_ = dVar6 * (double)p0.super_dgTemplateVector<float>._0_8_;
                auVar8 = vfmsub231sd_fma(auVar54,auVar62,auVar61);
                auVar48._8_8_ = 0;
                auVar48._0_8_ =
                     (double)p2.super_dgTemplateVector<float>._0_8_ *
                     (double)p0.super_dgTemplateVector<float>._8_8_;
                auVar37 = vfmsub231sd_fma(auVar48,auVar40,auVar63);
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar26;
                auVar55._8_8_ = 0;
                auVar55._0_8_ = auVar8._0_8_ * (double)pdVar17;
                auVar4 = vfmadd231sd_fma(auVar55,auVar4,auVar1);
                auVar2._8_8_ = 0;
                auVar2._0_8_ = dVar56;
                auVar4 = vfmadd132sd_fma(auVar37,auVar4,auVar2);
                _p0 = dVar16;
                if (0.004999999888241291 < auVar4._0_8_) goto LAB_00da4ae6;
                pdVar28->m_mark = HVar19;
                dStack_1a0d8 = dVar6;
                p0.super_dgTemplateVector<float> = dVar18.super_dgTemplateVector<float>;
                p1_1.super_dgTemplateVector<double>.m_y._0_4_ = p1.super_dgTemplateVector<float>.m_z
                ;
                p1_1.super_dgTemplateVector<double>.m_x =
                     (double)p1.super_dgTemplateVector<float>._0_8_;
                p1_1.super_dgTemplateVector<double>.m_y._4_4_ = p1.super_dgTemplateVector<float>.m_w
                ;
                p1_1.super_dgTemplateVector<double>.m_z = dVar9;
                p1_1.super_dgTemplateVector<double>.m_w = dVar15;
                pdVar28 = pdVar28->m_next;
                dStack_1a188 = dVar6;
                uVar12 = p2.super_dgTemplateVector<float>._0_8_;
                uVar13 = p2.super_dgTemplateVector<float>._8_8_;
              } while (pdVar28 != pdVar25);
              p1.super_dgTemplateVector<float>.m_x = 0.0;
              p1.super_dgTemplateVector<float>.m_y = 0.0;
              p2 = dVar18;
              p1.super_dgTemplateVector<float>._8_8_ = &flatFace;
              p1.super_dgTemplateVector<float>._0_8_ =
                   dgTree<dgEdge,_long>::Minimum(&flatFace.super_dgTree<dgEdge,_long>);
              while (dVar18.super_dgTemplateVector<float> = p2.super_dgTemplateVector<float>,
                    p1.super_dgTemplateVector<float>._0_8_ != 0) {
                if ((*(int *)(p1.super_dgTemplateVector<float>._0_8_ + 0x2c) < 0) &&
                   (*(int *)(p1.super_dgTemplateVector<float>._0_8_ + 0x50) < HVar19))
                goto LAB_00da4ae6;
                dgTree<dgEdge,_long>::Iterator::operator++((Iterator *)&p1,0);
              }
              if (2 < (int)uVar29) {
                lVar30 = -1;
                pdVar28 = pdVar25;
                lVar27 = 0;
                do {
                  lVar31 = lVar27;
                  lVar24 = lVar30;
                  polygon[lVar24 + 1] = pdVar28->m_incidentVertex;
                  if (lVar24 == 0x1ffe) {
                    __assert_fail("count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xebe,
                                  "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                 );
                  }
                  pdVar28 = pdVar28->m_next;
                  lVar30 = lVar24 + 1;
                  lVar27 = lVar31 + 1;
                } while (pdVar28 != pdVar25);
                bVar34 = true;
                for (iVar33 = 0; iVar33 < (int)(lVar24 + 1); iVar33 = iVar33 + 1) {
                  lVar27 = (long)iVar33;
                  lVar30 = 0;
                  do {
                    if (lVar31 - lVar27 == lVar30) goto LAB_00da4bd0;
                    lVar14 = lVar30 + 1;
                    lVar30 = lVar30 + 1;
                  } while (polygon[lVar27] != polygon[lVar27 + lVar14]);
                  bVar34 = false;
                  iVar33 = (int)lVar24 + 2;
LAB_00da4bd0:
                }
                if (!bVar34) {
LAB_00da4ae6:
                  p2.super_dgTemplateVector<float> = dVar18.super_dgTemplateVector<float>;
                  for (uVar23 = 0; (~((int)uVar29 >> 0x1f) & uVar29) != uVar23; uVar23 = uVar23 + 1)
                  {
                    pdVar25 = diagonalsPool[uVar23];
                    bVar34 = IsEssensialPointDiagonal(pdVar25,(dgBigVector *)&iter_1,vertex,stride);
                    if (!bVar34) {
                      bVar34 = IsEssensialPointDiagonal
                                         (pdVar25->m_twin,(dgBigVector *)&iter_1,vertex,stride);
                      if (!bVar34) {
                        DeleteEdge(&flatFace,pdVar25);
                      }
                    }
                  }
                  goto LAB_00da4c04;
                }
              }
              for (uVar23 = 0; (~((int)uVar29 >> 0x1f) & uVar29) != uVar23; uVar23 = uVar23 + 1) {
                DeleteEdge(&flatFace,diagonalsPool[uVar23]);
              }
            }
LAB_00da4c04:
            HVar19 = IncLRU(&flatFace);
            iter_1.m_ptr = (dgRedBackNode *)0x0;
            iter_1.m_tree = &flatFace.super_dgTree<dgEdge,_long>;
            iter_1.m_ptr = &dgTree<dgEdge,_long>::Minimum(&flatFace.super_dgTree<dgEdge,_long>)->
                            super_dgRedBackNode;
            while (iter_1.m_ptr != (dgRedBackNode *)0x0) {
              if ((*(int *)&iter_1.m_ptr[2]._vptr_dgRedBackNode != HVar19) &&
                 (0 < *(int *)((long)&iter_1.m_ptr[1]._vptr_dgRedBackNode + 4))) {
                pdVar26 = iter_1.m_ptr + 1;
                uVar23 = 0;
                do {
                  uVar32 = uVar23;
                  polygon[uVar32] = *(HaI32 *)&pdVar26->_vptr_dgRedBackNode;
                  if (uVar32 == 0x1fff) {
                    __assert_fail("diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0]))"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                  ,0xeea,
                                  "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                                 );
                  }
                  *(HaI32 *)&pdVar26[1]._vptr_dgRedBackNode = HVar19;
                  pdVar26 = pdVar26->m_right;
                  uVar23 = uVar32 + 1;
                } while (pdVar26 != iter_1.m_ptr + 1);
                if (1 < uVar32) {
                  AddFace(&buildConvex,(HaI32)(uVar32 + 1),polygon);
                }
              }
              dgTree<dgEdge,_long>::Iterator::operator++(&iter_1,0);
            }
          }
          iter.m_ptr = &dgTree<dgEdge,_long>::Minimum(iter.m_tree)->super_dgRedBackNode;
          ~dgPolyhedra(&flatFace);
        }
      }
      EndFace(&buildConvex);
      if ((this->super_dgTree<dgEdge,_long>).m_count != 0) {
        __assert_fail("GetCount() == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0xefa,
                      "void dgPolyhedra::ConvexPartition(const hacd::HaF64 *const, hacd::HaI32, dgPolyhedra *const)"
                     );
      }
      pdVar20 = (this->super_dgTree<dgEdge,_long>).m_head;
      (this->super_dgTree<dgEdge,_long>).m_head = buildConvex.super_dgTree<dgEdge,_long>.m_head;
      (this->super_dgTree<dgEdge,_long>).m_count = buildConvex.super_dgTree<dgEdge,_long>.m_count;
      buildConvex.super_dgTree<dgEdge,_long>.m_count = 0;
      buildConvex.super_dgTree<dgEdge,_long>.m_head = pdVar20;
      ~dgPolyhedra(&buildConvex);
    }
  }
  return;
}

Assistant:

void dgPolyhedra::ConvexPartition (const hacd::HaF64* const vertex, hacd::HaI32 strideInBytes, dgPolyhedra* const leftOversOut)
{
	if (GetCount()) {
		Triangulate (vertex, strideInBytes, leftOversOut);
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));
		Optimize (vertex, strideInBytes, hacd::HaF32 (1.0e-4f));
		DeleteDegenerateFaces (vertex, strideInBytes, hacd::HaF32 (1.0e-5f));

		if (GetCount()) {
			hacd::HaI32 removeCount = 0;
			hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

			hacd::HaI32 polygon[1024 * 8];
			dgEdge* diagonalsPool[1024 * 8];
			dgPolyhedra buildConvex;

			buildConvex.BeginFace();
			dgPolyhedra::Iterator iter (*this);
			for (iter.Begin(); iter; ) {
				dgEdge* edge = &(*iter);
				iter++;
				if (edge->m_incidentFace > 0) {

					dgPolyhedra flatFace;
					MarkAdjacentCoplanarFaces (flatFace, edge, vertex, strideInBytes);

					if (flatFace.GetCount()) {
						flatFace.RefineTriangulation (vertex, stride);
						RemoveColinearVertices (flatFace, vertex, stride);

						hacd::HaI32 diagonalCount = GetInteriorDiagonals (flatFace, diagonalsPool, sizeof (diagonalsPool) / sizeof (diagonalsPool[0]));
						if (diagonalCount) {
							edge = &flatFace.GetRoot()->GetInfo();
							if (edge->m_incidentFace < 0) {
								edge = edge->m_twin;
							}
							HACD_ASSERT (edge->m_incidentFace > 0);

							dgBigVector normal (FaceNormal (edge, vertex, strideInBytes));
							normal = normal.Scale (hacd::HaF64 (1.0f) / sqrt (normal % normal));

							edge = NULL;
							dgPolyhedra::Iterator iter (flatFace);
							for (iter.Begin(); iter; iter ++) {
								edge = &(*iter);
								if (edge->m_incidentFace < 0) {
									break;
								}
							}
							HACD_ASSERT (edge);

							hacd::HaI32 isConvex = 1;
							dgEdge* ptr = edge;
							hacd::HaI32 mark = flatFace.IncLRU();

							dgBigVector normal2 (normal);
							dgBigVector p0 (&vertex[ptr->m_prev->m_incidentVertex * stride]);
							dgBigVector p1 (&vertex[ptr->m_incidentVertex * stride]);
							dgBigVector e0 (p1 - p0);
							e0 = e0.Scale (hacd::HaF32 (1.0f) / (dgSqrt (e0 % e0) + hacd::HaF32 (1.0e-14f)));
							do {
								dgBigVector p2 (&vertex[ptr->m_next->m_incidentVertex * stride]);
								dgBigVector e1 (p2 - p1);
								e1 = e1.Scale (hacd::HaF32 (1.0f) / (sqrt (e1 % e1) + hacd::HaF32 (1.0e-14f)));
								hacd::HaF64 dot = (e0 * e1) % normal2;
								//if (dot > hacd::HaF32 (0.0f)) {
								if (dot > hacd::HaF32 (5.0e-3f)) {
									isConvex = 0;
									break;
								}
								ptr->m_mark = mark;
								e0 = e1;
								p1 = p2;
								ptr = ptr->m_next;
							} while (ptr != edge);

							if (isConvex) {
								dgPolyhedra::Iterator iter (flatFace);
								for (iter.Begin(); iter; iter ++) {
									ptr = &(*iter);
									if (ptr->m_incidentFace < 0) {
										if (ptr->m_mark < mark) {
											isConvex = 0;
											break;
										}
									}
								}
							}

							if (isConvex) {
								if (diagonalCount > 2) {
									hacd::HaI32 count = 0;
									ptr = edge;
									do {
										polygon[count] = ptr->m_incidentVertex;				
										count ++;
										HACD_ASSERT (count < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr = ptr->m_next;
									} while (ptr != edge);

									for (hacd::HaI32 i = 0; i < count - 1; i ++) {
										for (hacd::HaI32 j = i + 1; j < count; j ++) {
											if (polygon[i] == polygon[j]) {
												i = count;
												isConvex = 0;
												break ;
											}
										}
									}
								}
							}

							if (isConvex) {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									removeCount ++;
									flatFace.DeleteEdge (diagonal);
								}
							} else {
								for (hacd::HaI32 j = 0; j < diagonalCount; j ++) {
									dgEdge* const diagonal = diagonalsPool[j];
									if (!IsEssensialDiagonal(diagonal, normal, vertex, stride)) {
										removeCount ++;
										flatFace.DeleteEdge (diagonal);
									}
								}
							}
						}

						hacd::HaI32 mark = flatFace.IncLRU();
						dgPolyhedra::Iterator iter (flatFace);
						for (iter.Begin(); iter; iter ++) {
							dgEdge* const edge = &(*iter);
							if (edge->m_mark != mark) {
								if (edge->m_incidentFace > 0) {
									dgEdge* ptr = edge;
									hacd::HaI32 diagonalCount = 0;
									do {
										polygon[diagonalCount] = ptr->m_incidentVertex;				
										diagonalCount ++;
										HACD_ASSERT (diagonalCount < hacd::HaI32 (sizeof (polygon) / sizeof (polygon[0])));
										ptr->m_mark = mark;
										ptr = ptr->m_next;
									} while (ptr != edge);
									if (diagonalCount >= 3) {
										buildConvex.AddFace (diagonalCount, polygon);
									}
								}
							}
						}
					}
					iter.Begin();
				}
			}

			buildConvex.EndFace();
			HACD_ASSERT (GetCount() == 0);
			SwapInfo(buildConvex);
		}
	}
}